

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

Locale * __thiscall
icu_63::RuleBasedCollator::getLocale
          (Locale *__return_storage_ptr__,RuleBasedCollator *this,ULocDataLocaleType type,
          UErrorCode *errorCode)

{
  Locale *other;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (type == ULOC_VALID_LOCALE) {
      other = &this->validLocale;
      goto LAB_00221c5a;
    }
    if (type == ULOC_ACTUAL_LOCALE) {
      other = &this->tailoring->actualLocale;
      if (this->actualLocaleIsSameAsValid != '\0') {
        other = &this->validLocale;
      }
      goto LAB_00221c5a;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  other = Locale::getRoot();
LAB_00221c5a:
  Locale::Locale(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

Locale
RuleBasedCollator::getLocale(ULocDataLocaleType type, UErrorCode& errorCode) const {
    if(U_FAILURE(errorCode)) {
        return Locale::getRoot();
    }
    switch(type) {
    case ULOC_ACTUAL_LOCALE:
        return actualLocaleIsSameAsValid ? validLocale : tailoring->actualLocale;
    case ULOC_VALID_LOCALE:
        return validLocale;
    case ULOC_REQUESTED_LOCALE:
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return Locale::getRoot();
    }
}